

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

client * workspace_find_window_client(workspace *workspace,xcb_window_t window)

{
  client *pcVar1;
  list *plVar2;
  
  plVar2 = workspace->clients;
  do {
    plVar2 = (list *)plVar2->head;
    if (plVar2 == (list *)0x0) {
      return (client *)0x0;
    }
    pcVar1 = (client *)plVar2->size;
  } while ((pcVar1 == (client *)0x0) || (pcVar1->window != window));
  return pcVar1;
}

Assistant:

struct client *workspace_find_window_client(const struct workspace *workspace, xcb_window_t window)
{
        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL) {
                        continue;
                }

                if (client->window == window) {
                        return client;
                }
        }

        return NULL;
}